

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::PeekAndCheckType(TypeChecker *this,Index depth,Type expected)

{
  Result RVar1;
  Enum EVar2;
  Enum EVar3;
  bool bVar4;
  Type actual;
  Type local_18;
  
  local_18.enum_ = Any;
  local_18.type_index_ = 0xffffffff;
  RVar1 = PeekType(this,depth,&local_18);
  EVar3 = expected.enum_;
  EVar2 = local_18.enum_;
  if (EVar2 == Any || EVar3 == Any) {
    bVar4 = false;
  }
  else {
    if (EVar2 == Reference && EVar3 == Reference) {
      bVar4 = ((ulong)local_18 ^ (ulong)expected) >> 0x20 == 0;
    }
    else {
      bVar4 = EVar2 == EVar3;
    }
    bVar4 = !bVar4;
  }
  return (Result)(uint)(byte)(RVar1.enum_ == Error | bVar4);
}

Assistant:

Result TypeChecker::PeekAndCheckType(Index depth, Type expected) {
  Type actual = Type::Any;
  Result result = PeekType(depth, &actual);
  return result | CheckType(actual, expected);
}